

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O0

int main(void)

{
  pointer this;
  type local_19;
  thread local_18;
  thread thread;
  __single_object coro;
  
  std::make_unique<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>();
  this = std::
         unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
         ::operator->((unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
                       *)&thread);
  SCoro::SCoro<PauseResume::Start,_PauseResume::Event>::Poll(this);
  std::thread::
  thread<main::__0,std::unique_ptr<SCoro::SCoro<PauseResume::Start,PauseResume::Event>,std::default_delete<SCoro::SCoro<PauseResume::Start,PauseResume::Event>>>,void>
            (&local_18,&local_19,
             (unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
              *)&thread);
  std::thread::join();
  std::thread::~thread(&local_18);
  std::
  unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
  ::~unique_ptr((unique_ptr<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>,_std::default_delete<SCoro::SCoro<PauseResume::Start,_PauseResume::Event>_>_>
                 *)&thread);
  return 0;
}

Assistant:

int main()
{
    auto coro = std::make_unique<PauseResume::scoro>();
    coro->Poll();
    // simulate async event
    // This could be finished by an interrupt or scheduler, timer, IOCP etc...
    std::thread thread
    {
        [](decltype(coro) continue_after_event)
        {
            std::string input;
            std::getline(std::cin, input);
            if (input.compare("x") == 0)
            {
                continue_after_event->Poll();
            }
        },
        std::move(coro)
    };

    thread.join();
}